

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,
                    SQBool throwerror)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool res;
  SQObjectPtr dummy;
  SQInteger target;
  SQObjectPtr ret;
  SQBool in_stack_00000570;
  SQObjectPtr *in_stack_00000578;
  SQInteger in_stack_00000580;
  SQInteger in_stack_00000588;
  SQObjectPtr *in_stack_00000590;
  SQVM *in_stack_00000598;
  ExecutionType in_stack_000005b0;
  SQBool in_stack_000005f0;
  SQObjectPtr *in_stack_000005f8;
  SQInteger in_stack_00000600;
  SQInteger in_stack_00000608;
  SQObjectPtr *in_stack_00000610;
  SQVM *in_stack_00000618;
  ExecutionType in_stack_00000630;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  HSQUIRRELVM in_stack_ffffffffffffff60;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  bool bVar1;
  undefined1 in_stack_ffffffffffffff6f;
  SQVM *in_stack_ffffffffffffff70;
  undefined8 local_8;
  
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  if (*(long *)(in_RDI + 0x148) == 0) {
    local_8 = sq_throwerror(in_stack_ffffffffffffff60,
                            (SQChar *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
    ;
  }
  else {
    if (in_RSI == 0) {
      if (*(long *)(in_RDI + 0x158) != -1) {
        in_stack_ffffffffffffff70 =
             (SQVM *)SQVM::GetAt(in_stack_ffffffffffffff60,
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        SQObjectPtr::Null((SQObjectPtr *)in_stack_ffffffffffffff70);
      }
    }
    else {
      if (*(long *)(in_RDI + 0x158) != -1) {
        SQVM::GetUp(in_stack_ffffffffffffff60,
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        SQVM::GetAt(in_stack_ffffffffffffff60,
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        SQObjectPtr::operator=
                  ((SQObjectPtr *)in_stack_ffffffffffffff70,
                   (SQObjectPtr *)
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(in_stack_ffffffffffffff6e,
                                     CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68)))
                  );
      }
      SQVM::Pop(in_stack_ffffffffffffff60);
    }
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
    if ((*(byte *)(in_RDI + 0x90) & 1) == 0) {
      in_stack_ffffffffffffff6d =
           SQVM::Execute<false>
                     (in_stack_00000598,in_stack_00000590,in_stack_00000588,in_stack_00000580,
                      in_stack_00000578,in_stack_00000570,in_stack_000005b0);
      bVar1 = (bool)in_stack_ffffffffffffff6d;
    }
    else {
      in_stack_ffffffffffffff6f =
           SQVM::Execute<true>(in_stack_00000618,in_stack_00000610,in_stack_00000608,
                               in_stack_00000600,in_stack_000005f8,in_stack_000005f0,
                               in_stack_00000630);
      bVar1 = (bool)in_stack_ffffffffffffff6f;
    }
    if (bVar1 == false) {
      local_8 = -1;
    }
    else {
      if (in_RDX != 0) {
        SQVM::Push(in_stack_ffffffffffffff70,
                   (SQObjectPtr *)
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffff6d,
                                                    in_stack_ffffffffffffff68))));
      }
      local_8 = 0;
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff60);
  return local_8;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;

    bool res = v->_debughook ?
        v->Execute<true>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM) :
        v->Execute<false>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM);

    if(!res)
        return SQ_ERROR;

    if(retval)
        v->Push(ret);
    return SQ_OK;
}